

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceModel.cpp
# Opt level: O0

void __thiscall
SequenceModel::replaceData
          (SequenceModel *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  Module *pMVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Module *pMVar2;
  size_type sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *seqdata;
  PermanentEditor ctx;
  size_t oldsize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  SequenceModel *this_local;
  
  Module::permanentEdit((PermanentEditor *)&seqdata,(this->super_GraphModel).mModule);
  this_00 = trackerboy::Sequence::data(this->mSequence);
  ctx.mModule = (Module *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_00,data);
  Module::PermanentEditor::~PermanentEditor((PermanentEditor *)&seqdata);
  GraphModel::dataChanged(&this->super_GraphModel);
  pMVar1 = ctx.mModule;
  pMVar2 = (Module *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  if (pMVar1 != pMVar2) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
    GraphModel::countChanged(&this->super_GraphModel,(int)sVar3);
  }
  return;
}

Assistant:

void SequenceModel::replaceData(std::vector<uint8_t> const& data) {
    size_t oldsize;
    {
        auto ctx = mModule.permanentEdit();
        auto &seqdata = mSequence->data();
        oldsize = seqdata.size();
        seqdata = data;
    }

    emit dataChanged();

    if (oldsize != data.size()) {
        emit countChanged((int)data.size());
    }
}